

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

char * PHYSFS_getWriteDir(void)

{
  char *local_10;
  char *retval;
  
  local_10 = (char *)0x0;
  __PHYSFS_platformGrabMutex(stateLock);
  if (writeDir != (DirHandle *)0x0) {
    local_10 = writeDir->dirName;
  }
  __PHYSFS_platformReleaseMutex(stateLock);
  return local_10;
}

Assistant:

const char *PHYSFS_getWriteDir(void)
{
    const char *retval = NULL;

    __PHYSFS_platformGrabMutex(stateLock);
    if (writeDir != NULL)
        retval = writeDir->dirName;
    __PHYSFS_platformReleaseMutex(stateLock);

    return retval;
}